

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O1

string * commify(string *__return_storage_ptr__,string *data)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  string result;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  uVar7 = (uint)data->_M_string_length;
  if ((int)uVar7 < 1) {
    lVar6 = -1;
    iVar5 = -1;
  }
  else {
    uVar3 = 0xffffffff;
    uVar4 = 0;
    uVar1 = 0xffffffff;
    do {
      iVar5 = (int)(data->_M_dataplus)._M_p[uVar4];
      if (iVar5 - 0x30U < 10) {
        uVar3 = uVar4 & 0xffffffff;
      }
      if (iVar5 == 0x2e) {
        uVar1 = uVar4 & 0xffffffff;
      }
      iVar5 = (int)uVar1;
      uVar4 = uVar4 + 1;
    } while ((uVar7 & 0x7fffffff) != uVar4);
    lVar6 = (long)(int)uVar3;
  }
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  uVar1 = (ulong)(int)uVar7;
  if (iVar5 == -1) {
    while (lVar6 < (long)(uVar1 - 1)) {
      std::__cxx11::string::push_back((char)&local_50);
      uVar1 = uVar1 - 1;
    }
    if (0 < (long)uVar1) {
      uVar3 = (ulong)((int)uVar1 - 1);
      iVar5 = 0;
      do {
        cVar2 = (char)&local_50;
        if ((int)(data->_M_dataplus)._M_p[uVar3] - 0x30U < 10) {
          std::__cxx11::string::push_back(cVar2);
          iVar5 = iVar5 + 1;
          if ((uVar3 != 0 && iVar5 == 3) &&
             (iVar5 = 3, (int)(data->_M_dataplus)._M_p[uVar3 - 1] - 0x30U < 10)) {
            iVar5 = 0;
            std::__cxx11::string::push_back(cVar2);
          }
        }
        else {
          std::__cxx11::string::push_back(cVar2);
        }
        uVar3 = uVar3 - 1;
        uVar7 = (int)uVar1 - 1;
        uVar1 = (ulong)uVar7;
      } while (0 < (int)uVar7);
    }
  }
  else {
    for (; (long)iVar5 < (long)uVar1; uVar1 = uVar1 - 1) {
      std::__cxx11::string::push_back((char)&local_50);
    }
    if (0 < (long)uVar1) {
      uVar3 = (ulong)((int)uVar1 - 1);
      iVar5 = 0;
      do {
        cVar2 = (char)&local_50;
        if ((int)(data->_M_dataplus)._M_p[uVar3] - 0x30U < 10) {
          std::__cxx11::string::push_back(cVar2);
          iVar5 = iVar5 + 1;
          if ((uVar3 != 0 && iVar5 == 3) &&
             (iVar5 = 3, (int)(data->_M_dataplus)._M_p[uVar3 - 1] - 0x30U < 10)) {
            iVar5 = 0;
            std::__cxx11::string::push_back(cVar2);
          }
        }
        else {
          std::__cxx11::string::push_back(cVar2);
        }
        uVar3 = uVar3 - 1;
        uVar7 = (int)uVar1 - 1;
        uVar1 = (ulong)uVar7;
      } while (0 < (int)uVar7);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (iVar5 = (int)local_48; 0 < iVar5; iVar5 = iVar5 + -1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string commify (const std::string& data)
{
  // First scan for decimal point and end of digits.
  int decimalPoint = -1;
  int end          = -1;

  int i;
  for (int i = 0; i < (int) data.length (); ++i)
  {
    if (isdigit (data[i]))
      end = i;

    if (data[i] == '.')
      decimalPoint = i;
  }

  std::string result;
  if (decimalPoint != -1)
  {
    // In reverse order, transfer all digits up to, and including the decimal
    // point.
    for (i = (int) data.length () - 1; i >= decimalPoint; --i)
      result += data[i];

    int consecutiveDigits = 0;
    for (; i >= 0; --i)
    {
      if (isdigit (data[i]))
      {
        result += data[i];

        if (++consecutiveDigits == 3 && i && isdigit (data[i - 1]))
        {
          result += ',';
          consecutiveDigits = 0;
        }
      }
      else
        result += data[i];
    }
  }
  else
  {
    // In reverse order, transfer all digits up to, but not including the last
    // digit.
    for (i = (int) data.length () - 1; i > end; --i)
      result += data[i];

    int consecutiveDigits = 0;
    for (; i >= 0; --i)
    {
      if (isdigit (data[i]))
      {
        result += data[i];

        if (++consecutiveDigits == 3 && i && isdigit (data[i - 1]))
        {
          result += ',';
          consecutiveDigits = 0;
        }
      }
      else
        result += data[i];
    }
  }

  // reverse result into data.
  std::string done;
  for (int i = (int) result.length () - 1; i >= 0; --i)
    done += result[i];

  return done;
}